

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O0

wchar_t square_num_walls_adjacent(chunk *c,loc_conflict grid)

{
  _Bool _Var1;
  loc_conflict lVar2;
  square_conflict *psVar3;
  wchar_t local_1c;
  wchar_t k;
  chunk *c_local;
  loc_conflict grid_local;
  
  _Var1 = square_in_bounds(c,grid);
  if (!_Var1) {
    __assert_fail("square_in_bounds(c, grid)",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cave-square.c"
                  ,0x4b0,"int square_num_walls_adjacent(struct chunk *, struct loc)");
  }
  lVar2 = (loc_conflict)next_grid((loc)grid,L'\x02');
  psVar3 = square(c,lVar2);
  _Var1 = feat_is_wall((uint)psVar3->feat);
  local_1c = (wchar_t)_Var1;
  lVar2 = (loc_conflict)next_grid((loc)grid,L'\b');
  psVar3 = square(c,lVar2);
  _Var1 = feat_is_wall((uint)psVar3->feat);
  if (_Var1) {
    local_1c = local_1c + L'\x01';
  }
  lVar2 = (loc_conflict)next_grid((loc)grid,L'\x06');
  psVar3 = square(c,lVar2);
  _Var1 = feat_is_wall((uint)psVar3->feat);
  if (_Var1) {
    local_1c = local_1c + L'\x01';
  }
  lVar2 = (loc_conflict)next_grid((loc)grid,L'\x04');
  psVar3 = square(c,lVar2);
  _Var1 = feat_is_wall((uint)psVar3->feat);
  if (_Var1) {
    local_1c = local_1c + L'\x01';
  }
  return local_1c;
}

Assistant:

int square_num_walls_adjacent(struct chunk *c, struct loc grid)
{
    int k = 0;
    assert(square_in_bounds(c, grid));

    if (feat_is_wall(square(c, next_grid(grid, DIR_S))->feat)) k++;
	if (feat_is_wall(square(c, next_grid(grid, DIR_N))->feat)) k++;
    if (feat_is_wall(square(c, next_grid(grid, DIR_E))->feat)) k++;
    if (feat_is_wall(square(c, next_grid(grid, DIR_W))->feat)) k++;

    return k;
}